

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O1

string * __thiscall
duckdb::ArrowExtensionMetadata::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ArrowExtensionMetadata *this)

{
  ostream *poVar1;
  ostringstream info;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  ::std::__cxx11::ostringstream::ostringstream(local_190);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Extension Name: ",0x10)
  ;
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(this->extension_name)._M_dataplus._M_p,
                      (this->extension_name)._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_63b5899 + 8,1);
  if ((this->vendor_name)._M_string_length != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Vendor: ",8);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(this->vendor_name)._M_dataplus._M_p,
                        (this->vendor_name)._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_63b5899 + 8,1);
  }
  if ((this->type_name)._M_string_length != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Type: ",6);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(this->type_name)._M_dataplus._M_p,
                        (this->type_name)._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_63b5899 + 8,1);
  }
  if ((this->arrow_format)._M_string_length != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Format: ",8);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(this->arrow_format)._M_dataplus._M_p,
                        (this->arrow_format)._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_63b5899 + 8,1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(local_190);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string ArrowExtensionMetadata::ToString() const {
	std::ostringstream info;
	info << "Extension Name: " << extension_name << "\n";
	if (!vendor_name.empty()) {
		info << "Vendor: " << vendor_name << "\n";
	}
	if (!type_name.empty()) {
		info << "Type: " << type_name << "\n";
	}
	if (!arrow_format.empty()) {
		info << "Format: " << arrow_format << "\n";
	}
	return info.str();
}